

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

void __thiscall QGraphicsItem::setOpacity(QGraphicsItem *this,qreal opacity)

{
  qreal *pqVar1;
  undefined1 *puVar2;
  QGraphicsItemPrivate *pQVar3;
  long in_FS_OFFSET;
  double dVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  QVariant local_88;
  anon_union_24_3_e3d07ef4_for_data local_68;
  undefined8 uStack_50;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined1 *puStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  ::QVariant::QVariant((QVariant *)&local_68,opacity);
  (*this->_vptr_QGraphicsItem[0x21])(&local_48,this,0x19,&local_68);
  ::QVariant::~QVariant((QVariant *)&local_68);
  dVar4 = (double)::QVariant::toReal((bool *)local_48.data);
  uVar5 = 0;
  uVar6 = 0x3ff00000;
  if (dVar4 <= 1.0) {
    uVar5 = SUB84(dVar4,0);
    uVar6 = (undefined4)((ulong)dVar4 >> 0x20);
  }
  if ((double)CONCAT44(uVar6,uVar5) <= 0.0) {
    uVar5 = 0;
    uVar6 = 0;
  }
  pQVar3 = (this->d_ptr).d;
  dVar4 = pQVar3->opacity;
  if (((double)CONCAT44(uVar6,uVar5) != dVar4) || (NAN((double)CONCAT44(uVar6,uVar5)) || NAN(dVar4))
     ) {
    pQVar3->opacity = (qreal)CONCAT44(uVar6,uVar5);
    (*this->_vptr_QGraphicsItem[0x21])(&local_88,this,0x1a);
    ::QVariant::~QVariant(&local_88);
    pQVar3 = (this->d_ptr).d;
    if (pQVar3->scene != (QGraphicsScene *)0x0) {
      QGraphicsItemPrivate::invalidateParentGraphicsEffectsRecursively(pQVar3);
      pQVar3 = (this->d_ptr).d;
      if ((pQVar3->field_0x164 & 0x80) == 0) {
        QGraphicsItemPrivate::invalidateChildGraphicsEffectsRecursively(pQVar3,OpacityChanged);
      }
      pQVar3 = (this->d_ptr).d;
      local_68._16_8_ = 0;
      uStack_50 = 0;
      local_68.shared = (PrivateShared *)0x0;
      local_68._8_8_ = 0;
      pqVar1 = &pQVar3->opacity;
      QGraphicsScenePrivate::markDirty
                (*(QGraphicsScenePrivate **)&pQVar3->scene->field_0x8,this,(QRectF *)&local_68,true,
                 false,*pqVar1 <= 0.001 && *pqVar1 != 0.001,false,false);
      if (dVar4 < 0.001) {
        puVar2 = &((this->d_ptr).d)->field_0x160;
        *(ulong *)puVar2 = *(ulong *)puVar2 | 0x10000000000000;
      }
    }
    if ((((this->d_ptr).d)->field_0x167 & 1) != 0) {
      QMetaObject::activate
                ((QObject *)(this + -1),&QGraphicsObject::staticMetaObject,1,(void **)0x0);
    }
  }
  ::QVariant::~QVariant((QVariant *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsItem::setOpacity(qreal opacity)
{
    // Notify change.
    const QVariant newOpacityVariant(itemChange(ItemOpacityChange, opacity));

    // Normalized opacity
    qreal newOpacity = qBound(qreal(0), newOpacityVariant.toReal(), qreal(1));

    // No change? Done.
    if (newOpacity == d_ptr->opacity)
        return;

    bool wasFullyTransparent = d_ptr->isOpacityNull();
    d_ptr->opacity = newOpacity;

    // Notify change.
    itemChange(ItemOpacityHasChanged, newOpacityVariant);

    // Update.
    if (d_ptr->scene) {
#if QT_CONFIG(graphicseffect)
        d_ptr->invalidateParentGraphicsEffectsRecursively();
        if (!(d_ptr->flags & ItemDoesntPropagateOpacityToChildren))
            d_ptr->invalidateChildGraphicsEffectsRecursively(QGraphicsItemPrivate::OpacityChanged);
#endif // QT_CONFIG(graphicseffect)
        d_ptr->scene->d_func()->markDirty(this, QRectF(),
                                          /*invalidateChildren=*/true,
                                          /*force=*/false,
                                          /*ignoreOpacity=*/d_ptr->isOpacityNull());
        if (wasFullyTransparent)
            d_ptr->paintedViewBoundingRectsNeedRepaint = 1;
    }

    if (d_ptr->isObject)
        emit static_cast<QGraphicsObject *>(this)->opacityChanged();
}